

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O2

void __thiscall
google::protobuf::util::converter::ProtoWriter::ProtoElement::ProtoElement
          (ProtoElement *this,TypeInfo *typeinfo,Type *type,ProtoWriter *enclosing)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree<const_google::protobuf::Field_*,_const_google::protobuf::Field_*,_std::_Identity<const_google::protobuf::Field_*>,_std::less<const_google::protobuf::Field_*>,_std::allocator<const_google::protobuf::Field_*>_>
  local_58;
  
  (this->super_BaseElement).parent_._M_t.
  super___uniq_ptr_impl<google::protobuf::util::converter::StructuredObjectWriter::BaseElement,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
  .
  super__Head_base<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_false>
  ._M_head_impl = (BaseElement *)0x0;
  (this->super_BaseElement).level_ = 0;
  (this->super_BaseElement)._vptr_BaseElement = (_func_int **)&PTR__ProtoElement_003e3e78;
  (this->super_LocationTrackerInterface)._vptr_LocationTrackerInterface =
       (_func_int **)&PTR__ProtoElement_003e3ea8;
  this->ow_ = enclosing;
  this->parent_field_ = (Field *)0x0;
  this->typeinfo_ = typeinfo;
  this->proto3_ = type->syntax_ == 1;
  this->type_ = type;
  p_Var1 = &(this->required_fields_)._M_t._M_impl.super__Rb_tree_header;
  (this->required_fields_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->required_fields_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->required_fields_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->required_fields_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->required_fields_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->size_index_ = -1;
  this->array_index_ = -1;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&this->oneof_indices_,
             (long)(type->oneofs_).super_RepeatedPtrFieldBase.current_size_ + 1,
             (allocator_type *)&local_58);
  if (this->proto3_ == false) {
    anon_unknown_8::GetRequiredFields
              ((set<const_google::protobuf::Field_*,_std::less<const_google::protobuf::Field_*>,_std::allocator<const_google::protobuf::Field_*>_>
                *)&local_58,this->type_);
    std::
    _Rb_tree<const_google::protobuf::Field_*,_const_google::protobuf::Field_*,_std::_Identity<const_google::protobuf::Field_*>,_std::less<const_google::protobuf::Field_*>,_std::allocator<const_google::protobuf::Field_*>_>
    ::operator=(&(this->required_fields_)._M_t,&local_58);
    std::
    _Rb_tree<const_google::protobuf::Field_*,_const_google::protobuf::Field_*,_std::_Identity<const_google::protobuf::Field_*>,_std::less<const_google::protobuf::Field_*>,_std::allocator<const_google::protobuf::Field_*>_>
    ::~_Rb_tree(&local_58);
  }
  return;
}

Assistant:

ProtoWriter::ProtoElement::ProtoElement(const TypeInfo* typeinfo,
                                        const google::protobuf::Type& type,
                                        ProtoWriter* enclosing)
    : BaseElement(nullptr),
      ow_(enclosing),
      parent_field_(nullptr),
      typeinfo_(typeinfo),
      proto3_(type.syntax() == google::protobuf::SYNTAX_PROTO3),
      type_(type),
      size_index_(-1),
      array_index_(-1),
      // oneof_indices_ values are 1-indexed (0 means not present).
      oneof_indices_(type.oneofs_size() + 1) {
  if (!proto3_) {
    required_fields_ = GetRequiredFields(type_);
  }
}